

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wait_handler.hpp
# Opt level: O1

void asio::detail::
     wait_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]mau/MauProxy.cpp:310:32)>
     ::do_complete(void *owner,operation *base,error_code *param_3,size_t param_4)

{
  Lock *__mutex;
  BufferAllocator *__mutex_00;
  ostringstream *this;
  uint uVar1;
  socket_type sVar2;
  DeliveryCommonData *pDVar3;
  QueueNode *ptr;
  QueueNode *pQVar4;
  MauSendHookFunction p_Var5;
  basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_> *pbVar6;
  long lVar7;
  undefined1 auVar8 [16];
  anon_class_8_1_8991fb9c this_00;
  int iVar9;
  OutputWorker *this_01;
  uint64_t uVar10;
  reactor_op *op;
  error_category *peVar11;
  uint16_t uVar12;
  base_implementation_type *impl;
  thread_info_base *this_thread;
  long in_FS_OFFSET;
  bool bVar13;
  UDPAddress destAddress;
  binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]mau_MauProxy_cpp:310:32),_std::error_code>
  handler;
  ptr p;
  anon_class_16_2_3fe397bd local_218;
  data_union local_204;
  anon_class_8_1_8991fb9c local_1e8;
  scheduler_operation *local_1e0;
  func_type p_Stack_1d8;
  ptr local_1d0;
  undefined1 local_1b8 [8];
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  local_1e8.this = *(DeliveryChannel **)&base[1].task_result_;
  local_1d0.h = &local_1e8;
  local_1e0 = base[1].next_;
  p_Stack_1d8 = base[1].func_;
  local_1d0.v = (wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]mau_MauProxy_cpp:310:32)>
                 *)base;
  local_1d0.p = (wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]mau_MauProxy_cpp:310:32)>
                 *)base;
  wait_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]mau/MauProxy.cpp:310:32)>
  ::ptr::reset(&local_1d0);
  this_00.this = local_1e8.this;
  if (owner != (void *)0x0) {
    __mutex = &(local_1e8.this)->QueueLock;
    iVar9 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (iVar9 != 0) {
LAB_00110de0:
      std::__throw_system_error(iVar9);
    }
    (this_00.this)->NextTimerWakeUsec = 0;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    if ((int)local_1e0 == 0) {
      mau::LockedValue<asio::ip::basic_endpoint<asio::ip::udp>_>::Get
                ((basic_endpoint<asio::ip::udp> *)&local_204.base,&(this_00.this)->DeliveryAddress);
      if (local_204.base.sa_family == 2) {
        bVar13 = local_204.v6.sin6_flowinfo == 0;
      }
      else {
        auVar8._4_4_ = local_204._12_4_;
        auVar8._0_4_ = local_204._8_4_;
        auVar8._8_4_ = local_204._16_4_;
        auVar8._12_4_ = local_204._20_4_;
        bVar13 = auVar8 == (undefined1  [16])0x0;
      }
      if (!bVar13) {
        uVar10 = mau::GetTimeUsec();
        iVar9 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
        while (iVar9 == 0) {
          ptr = ((this_00.this)->Queue).Head;
          if ((ptr == (QueueNode *)0x0) || ((long)(uVar10 - ptr->DeliveryUsec) < 0)) {
            pthread_mutex_unlock((pthread_mutex_t *)__mutex);
            mau::DeliveryChannel::postNextTimer(this_00.this);
            goto LAB_00110dfa;
          }
          pQVar4 = ptr->Next;
          ((this_00.this)->Queue).Head = pQVar4;
          if (pQVar4 == (QueueNode *)0x0) {
            ((this_00.this)->Queue).Tail = (QueueNode *)0x0;
          }
          else {
            pQVar4->Prev = (QueueNode *)0x0;
          }
          pthread_mutex_unlock((pthread_mutex_t *)__mutex);
          pDVar3 = (this_00.this)->Common;
          p_Var5 = (pDVar3->ProxyConfig).SendHook;
          if (p_Var5 == (MauSendHookFunction)0x0) {
            pbVar6 = (pDVar3->Socket)._M_t.
                     super___uniq_ptr_impl<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
                     .
                     super__Head_base<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_false>
                     ._M_head_impl;
            uVar1 = ptr->Bytes;
            local_218.this = this_00.this;
            lVar7 = *(long *)&(pbVar6->
                              super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>
                              ).
                              super_basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true>
            ;
            local_1b8 = (undefined1  [8])&local_218;
            if (*(long *)(in_FS_OFFSET + -8) == 0) {
              this_thread = (thread_info_base *)0x0;
            }
            else {
              this_thread = *(thread_info_base **)(*(long *)(in_FS_OFFSET + -8) + 8);
            }
            local_218.node = ptr;
            op = (reactor_op *)thread_info_base::allocate(this_thread,0x80);
            impl = (base_implementation_type *)
                   ((long)&(pbVar6->
                           super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>
                           ).
                           super_basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true>
                   + 8);
            local_1b0._8_8_ = 0;
            local_1b0._0_8_ = op;
            sVar2 = impl->socket_;
            (op->super_operation).next_ = (scheduler_operation *)0x0;
            (op->super_operation).func_ =
                 reactive_socket_sendto_op<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]mau/MauProxy.cpp:374:34)>
                 ::do_complete;
            (op->super_operation).task_result_ = 0;
            (op->ec_)._M_value = 0;
            peVar11 = (error_category *)std::_V2::system_category();
            (op->ec_)._M_cat = peVar11;
            op->bytes_transferred_ = 0;
            op->perform_func_ =
                 reactive_socket_sendto_op_base<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>_>
                 ::do_perform;
            *(socket_type *)&op[1].super_operation.next_ = sVar2;
            op[1].super_operation.func_ = (func_type)ptr->Data;
            *(ulong *)&op[1].super_operation.task_result_ = (ulong)uVar1;
            *(ulong *)&op[1].ec_ =
                 CONCAT44(local_204.v6.sin6_flowinfo,
                          CONCAT22(local_204.v4.sin_port,local_204.base.sa_family));
            op[1].ec_._M_cat = (error_category *)CONCAT44(local_204._12_4_,local_204._8_4_);
            *(ulong *)((long)&op[1].ec_._M_cat + 4) = CONCAT44(local_204._16_4_,local_204._12_4_);
            *(ulong *)((long)&op[1].bytes_transferred_ + 4) =
                 CONCAT44(local_204.v6.sin6_scope_id,local_204._20_4_);
            *(undefined4 *)((long)&op[1].perform_func_ + 4) = 0;
            op[2].super_operation.next_ = (scheduler_operation *)local_218.this;
            op[2].super_operation.func_ = (func_type)local_218.node;
            local_1b0._8_8_ = op;
            reactive_socket_service_base::start_op
                      ((reactive_socket_service_base *)(lVar7 + 0x28),impl,1,op,false,true,false);
            local_1b0._0_16_ = (undefined1  [16])0x0;
            reactive_socket_sendto_op<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]mau/MauProxy.cpp:374:34)>
            ::ptr::reset((ptr *)local_1b8);
          }
          else {
            uVar12 = swap_bytes(local_204.v4.sin_port);
            (*p_Var5)((pDVar3->ProxyConfig).SendHookContext,uVar12,ptr->Data,ptr->Bytes);
            pDVar3 = (this_00.this)->Common;
            __mutex_00 = &pDVar3->ReadBufferAllocator;
            iVar9 = pthread_mutex_lock((pthread_mutex_t *)__mutex_00);
            if (iVar9 != 0) break;
            pktalloc::Allocator::Free(&(pDVar3->ReadBufferAllocator).Allocator,(uint8_t *)ptr);
            pthread_mutex_unlock((pthread_mutex_t *)__mutex_00);
          }
          iVar9 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
        }
        goto LAB_00110de0;
      }
      pDVar3 = (this_00.this)->Common;
      if ((int)(pDVar3->Logger).ChannelMinLevel < 3) {
        local_1b8 = (undefined1  [8])(pDVar3->Logger).ChannelName;
        this = (ostringstream *)(local_1b0 + 8);
        local_1b0._0_4_ = 2;
        std::__cxx11::ostringstream::ostringstream(this);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this,(pDVar3->Logger).Prefix._M_dataplus._M_p,
                   (pDVar3->Logger).Prefix._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this,"Delivery address unspecified - Abort",0x24);
        this_01 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(this_01,(LogStringBuffer *)local_1b8);
        std::__cxx11::ostringstream::~ostringstream(this);
        std::ios_base::~ios_base(local_138);
      }
    }
  }
LAB_00110dfa:
  wait_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]mau/MauProxy.cpp:310:32)>
  ::ptr::reset(&local_1d0);
  return;
}

Assistant:

static void do_complete(void* owner, operation* base,
      const asio::error_code& /*ec*/,
      std::size_t /*bytes_transferred*/)
  {
    // Take ownership of the handler object.
    wait_handler* h(static_cast<wait_handler*>(base));
    ptr p = { asio::detail::addressof(h->handler_), h, h };
    handler_work<Handler> w(h->handler_);

    ASIO_HANDLER_COMPLETION((*h));

    // Make a copy of the handler so that the memory can be deallocated before
    // the upcall is made. Even if we're not about to make an upcall, a
    // sub-object of the handler may be the true owner of the memory associated
    // with the handler. Consequently, a local copy of the handler is required
    // to ensure that any owning sub-object remains valid until after we have
    // deallocated the memory here.
    detail::binder1<Handler, asio::error_code>
      handler(h->handler_, h->ec_);
    p.h = asio::detail::addressof(handler.handler_);
    p.reset();

    // Make the upcall if required.
    if (owner)
    {
      fenced_block b(fenced_block::half);
      ASIO_HANDLER_INVOCATION_BEGIN((handler.arg1_));
      w.complete(handler, handler.handler_);
      ASIO_HANDLER_INVOCATION_END;
    }
  }